

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CamCal.cpp
# Opt level: O3

void __thiscall C2dPtSel::initialize(C2dPtSel *this,CCfg *oCfg,Mat *oImgFrm)

{
  double dVar1;
  undefined4 uVar2;
  Mat local_80 [96];
  
  memcpy(this,oCfg,0x309);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator=
            (&(this->m_oCfg).m_voCal2dPt,&oCfg->m_voCal2dPt);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator=
            (&(this->m_oCfg).m_voCal3dPt,&oCfg->m_voCal3dPt);
  uVar2 = *(undefined4 *)&oCfg->field_0x344;
  dVar1 = oCfg->m_fCalRansacReprojThld;
  (this->m_oCfg).m_nCalTyp = oCfg->m_nCalTyp;
  *(undefined4 *)&(this->m_oCfg).field_0x344 = uVar2;
  (this->m_oCfg).m_fCalRansacReprojThld = dVar1;
  (this->m_oCfg).m_oCalDispGrdDim.width = (oCfg->m_oCalDispGrdDim).width;
  (this->m_oCfg).m_oCalDispGrdDim.height = (oCfg->m_oCalDispGrdDim).height;
  (this->m_oCfg).m_bCalDistFlg = oCfg->m_bCalDistFlg;
  std::vector<float,_std::allocator<float>_>::operator=
            (&(this->m_oCfg).m_vfCalDistCoeff,&oCfg->m_vfCalDistCoeff);
  std::vector<float,_std::allocator<float>_>::operator=
            (&(this->m_oCfg).m_vfCalFocLen,&oCfg->m_vfCalFocLen);
  std::vector<float,_std::allocator<float>_>::operator=
            (&(this->m_oCfg).m_vfCalPrinPt,&oCfg->m_vfCalPrinPt);
  cv::Mat::operator=(&(this->m_oCfg).m_oCalIntMat,&oCfg->m_oCalIntMat);
  cv::Mat::operator=(&(this->m_oCfg).m_oCalDistCoeffMat,&oCfg->m_oCalDistCoeffMat);
  cv::Mat::clone();
  cv::Mat::operator=(&this->m_oImgFrm,local_80);
  cv::Mat::~Mat(local_80);
  return;
}

Assistant:

void C2dPtSel::initialize(CCfg oCfg, cv::Mat oImgFrm)
{
	// configuration parameters
	m_oCfg = oCfg;

	// frame image for plotting results
	m_oImgFrm = oImgFrm.clone();
}